

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O3

void lysp_tpdf_free(lysf_ctx *ctx,lysp_tpdf *tpdf)

{
  lysp_ext_instance *plVar1;
  long lVar2;
  lysp_ext_instance *plVar3;
  
  lydict_remove(ctx->ctx,tpdf->name);
  lydict_remove(ctx->ctx,tpdf->units);
  lydict_remove(ctx->ctx,(tpdf->dflt).str);
  lydict_remove(ctx->ctx,tpdf->dsc);
  lydict_remove(ctx->ctx,tpdf->ref);
  plVar1 = tpdf->exts;
  if (plVar1 != (lysp_ext_instance *)0x0) {
    plVar3 = (lysp_ext_instance *)0xffffffffffffffff;
    lVar2 = 0;
    do {
      plVar3 = (lysp_ext_instance *)((long)&plVar3->name + 1);
      if (plVar1[-1].exts <= plVar3) {
        free(&plVar1[-1].exts);
        break;
      }
      plVar1 = (lysp_ext_instance *)((long)&plVar1->name + lVar2);
      lVar2 = lVar2 + 0x70;
      lysp_ext_instance_free(ctx,plVar1);
      plVar1 = tpdf->exts;
    } while (plVar1 != (lysp_ext_instance *)0x0);
  }
  lysp_type_free(ctx,&tpdf->type);
  return;
}

Assistant:

static void
lysp_tpdf_free(struct lysf_ctx *ctx, struct lysp_tpdf *tpdf)
{
    lydict_remove(ctx->ctx, tpdf->name);
    lydict_remove(ctx->ctx, tpdf->units);
    lydict_remove(ctx->ctx, tpdf->dflt.str);
    lydict_remove(ctx->ctx, tpdf->dsc);
    lydict_remove(ctx->ctx, tpdf->ref);
    FREE_ARRAY(ctx, tpdf->exts, lysp_ext_instance_free);

    lysp_type_free(ctx, &tpdf->type);

}